

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

bool __thiscall EncodedS2LaxPolygonShape::Init(EncodedS2LaxPolygonShape *this,Decoder *decoder)

{
  bool bVar1;
  size_t sVar2;
  uint32 local_28;
  uchar local_21;
  uint32 num_loops;
  uint8 version;
  Decoder *decoder_local;
  EncodedS2LaxPolygonShape *this_local;
  
  _num_loops = decoder;
  decoder_local = (Decoder *)this;
  sVar2 = Decoder::avail(decoder);
  if (sVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_21 = Decoder::get8(_num_loops);
    if (local_21 == '\x01') {
      bVar1 = Decoder::get_varint32(_num_loops,&local_28);
      if (bVar1) {
        *(uint32 *)&(this->super_S2Shape).field_0xc = local_28;
        bVar1 = s2coding::EncodedS2PointVector::Init(&this->vertices_,_num_loops);
        if (bVar1) {
          if ((*(int *)&(this->super_S2Shape).field_0xc < 2) ||
             (bVar1 = s2coding::EncodedUintVector<unsigned_int>::Init
                                (&this->cumulative_vertices_,_num_loops), bVar1)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EncodedS2LaxPolygonShape::Init(Decoder* decoder) {
  if (decoder->avail() < 1) return false;
  uint8 version = decoder->get8();
  if (version != kCurrentEncodingVersionNumber) return false;

  uint32 num_loops;
  if (!decoder->get_varint32(&num_loops)) return false;
  num_loops_ = num_loops;

  if (!vertices_.Init(decoder)) return false;

  if (num_loops_ > 1) {
    if (!cumulative_vertices_.Init(decoder)) return false;
  }
  return true;
}